

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O0

_Bool hasAttribute(xmlNodePtr node,xmlChar *name)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  xmlAttr *attr;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 0x58);
  while( true ) {
    if (local_20 == 0) {
      return false;
    }
    iVar1 = xmlStrEqual(*(undefined8 *)(local_20 + 0x10),in_RSI);
    if (iVar1 != 0) break;
    local_20 = *(long *)(local_20 + 0x30);
  }
  return true;
}

Assistant:

static bool hasAttribute(xmlNodePtr node, const xmlChar* name) {
    xmlAttr *attr = node->properties;
    while (attr) {
        if (xmlStrEqual(attr->name, name)) {
            return true;
        }
        attr = attr->next;
    }

    return false;
}